

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

RtMidiOutPtr rtmidi_out_create(RtMidiApi api,char *clientName)

{
  RtMidiOutPtr pRVar1;
  RtMidiOut *this;
  allocator<char> local_49;
  string name;
  
  pRVar1 = (RtMidiOutPtr)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&name,clientName,&local_49);
  this = (RtMidiOut *)operator_new(0x10);
  RtMidiOut::RtMidiOut(this,api,&name);
  pRVar1->ptr = this;
  pRVar1->data = (void *)0x0;
  pRVar1->ok = true;
  pRVar1->msg = "";
  std::__cxx11::string::~string((string *)&name);
  return pRVar1;
}

Assistant:

RtMidiOutPtr rtmidi_out_create (enum RtMidiApi api, const char *clientName)
{
    RtMidiWrapper* wrp = new RtMidiWrapper;
    std::string name = clientName;

    try {
        RtMidiOut* rOut = new RtMidiOut ((RtMidi::Api) api, name);

        wrp->ptr = (void*) rOut;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }


    return wrp;
}